

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O0

string * __thiscall
DifferentialEquation::getParameter
          (string *__return_storage_ptr__,DifferentialEquation *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  __type _Var3;
  ulong uVar4;
  size_type sVar5;
  ostream *poVar6;
  const_reference ppSVar7;
  const_reference ppSVar8;
  char *pcVar9;
  double dVar10;
  string local_5e0;
  string local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  stringstream local_580 [8];
  stringstream term_1;
  ostream local_570;
  uint local_3f8;
  int local_3f4;
  uint i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string local_3b0;
  stringstream local_390 [8];
  stringstream term;
  ostream local_380;
  uint local_204;
  undefined1 local_200 [4];
  uint i_1;
  int local_1dc;
  undefined1 local_1d8 [4];
  int i;
  stringstream local_1a8 [8];
  stringstream param;
  ostream local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  DifferentialEquation *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (DifferentialEquation *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar2 = std::operator==(local_20,"equation");
  if (bVar2) {
    poVar6 = std::operator<<(&local_198,"d ");
    Parametric::getName_abi_cxx11_((string *)local_1d8,(Parametric *)this);
    poVar6 = std::operator<<(poVar6,(string *)local_1d8);
    std::operator<<(poVar6," = ");
    std::__cxx11::string::~string((string *)local_1d8);
    for (local_1dc = 0; local_1dc < this->eqnTermAmount; local_1dc = local_1dc + 1) {
      if (local_1dc != 0) {
        std::operator<<(&local_198," + ");
      }
      poVar6 = std::operator<<(&local_198,"f");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1dc + 1);
      poVar6 = std::operator<<(poVar6,"(");
      Parametric::getName_abi_cxx11_((string *)local_200,(Parametric *)this);
      poVar6 = std::operator<<(poVar6,(string *)local_200);
      std::operator<<(poVar6,") ");
      std::__cxx11::string::~string((string *)local_200);
      poVar6 = std::operator<<(&local_198,"d X");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_1dc + 1);
      std::operator<<(poVar6," ");
    }
  }
  else {
    bVar2 = std::operator==(local_20,"starting-value");
    if (bVar2) {
      dVar10 = getStartingValue(this);
      std::ostream::operator<<(&local_198,dVar10);
    }
    else {
      bVar2 = std::operator==(local_20,"mode");
      if (bVar2) {
        bVar2 = isIto(this);
        pcVar9 = "stratonovitch";
        if (bVar2) {
          pcVar9 = "ito";
        }
        std::operator<<(&local_198,pcVar9);
      }
      else {
        for (local_204 = 0; uVar4 = (ulong)local_204,
            sVar5 = std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::size
                              (&this->eqnIntegrands), uVar4 < sVar5; local_204 = local_204 + 1) {
          std::__cxx11::stringstream::stringstream(local_390);
          poVar6 = std::operator<<(&local_380,"f");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_204 + 1);
          poVar6 = std::operator<<(poVar6,"(");
          Parametric::getName_abi_cxx11_(&local_3b0,(Parametric *)this);
          poVar6 = std::operator<<(poVar6,(string *)&local_3b0);
          std::operator<<(poVar6,")");
          std::__cxx11::string::~string((string *)&local_3b0);
          pbVar1 = local_20;
          std::__cxx11::stringstream::str();
          _Var3 = std::operator==(pbVar1,&local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
          if (_Var3) {
            ppSVar7 = std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::
                      operator[](&this->eqnIntegrands,(ulong)local_204);
            Parametric::getConfiguration_abi_cxx11_((string *)&i_2,(Parametric *)*ppSVar7);
            std::operator<<(&local_198,(string *)&i_2);
            std::__cxx11::string::~string((string *)&i_2);
            local_3f4 = 5;
          }
          else {
            local_3f4 = 0;
          }
          std::__cxx11::stringstream::~stringstream(local_390);
          if (local_3f4 != 0) break;
        }
        for (local_3f8 = 0; uVar4 = (ulong)local_3f8,
            sVar5 = std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::size
                              (&this->eqnIntegrands), uVar4 < sVar5; local_3f8 = local_3f8 + 1) {
          std::__cxx11::stringstream::stringstream(local_580);
          poVar6 = std::operator<<(&local_570,"X");
          std::ostream::operator<<(poVar6,local_3f8 + 1);
          pbVar1 = local_20;
          std::__cxx11::stringstream::str();
          _Var3 = std::operator==(pbVar1,&local_5a0);
          std::__cxx11::string::~string((string *)&local_5a0);
          if (_Var3) {
            poVar6 = std::operator<<(&local_198,"\"");
            ppSVar8 = std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::
                      operator[](&this->eqnIntegrators,(ulong)local_3f8);
            Parametric::getName_abi_cxx11_(&local_5c0,(Parametric *)*ppSVar8);
            poVar6 = std::operator<<(poVar6,(string *)&local_5c0);
            poVar6 = std::operator<<(poVar6,"\" ");
            ppSVar8 = std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::
                      operator[](&this->eqnIntegrators,(ulong)local_3f8);
            Parametric::getType_abi_cxx11_(&local_5e0,(Parametric *)*ppSVar8);
            std::operator<<(poVar6,(string *)&local_5e0);
            std::__cxx11::string::~string((string *)&local_5e0);
            std::__cxx11::string::~string((string *)&local_5c0);
            local_3f4 = 8;
          }
          else {
            local_3f4 = 0;
          }
          std::__cxx11::stringstream::~stringstream(local_580);
          if (local_3f4 != 0) break;
        }
      }
    }
  }
  std::__cxx11::stringstream::str();
  local_3f4 = 1;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string DifferentialEquation::getParameter( const string& name ) const
{
	stringstream param;
	
	// formula
	if (name=="equation") {
		param << "d " << getName() << " = ";
		for (int i=0; i<eqnTermAmount; ++i) {
			if (i) param << " + ";
			param << "f" << i+1 << "(" << getName() << ") ";
			param << "d X" << i+1 << " ";
		}
	}
	
	// first value
	else if (name=="starting-value")
		param << getStartingValue();
	
	// mode
	else if (name=="mode")
		param << (isIto() ? "ito" : "stratonovitch");
	
	// parameters for single terms
	else {
		
		// parameters for integrands
		for (uint i=0; i<eqnIntegrands.size(); ++i) {
			stringstream term;
			term << "f" << i+1 << "(" << getName() << ")";
			if (name == term.str()) {
				param << eqnIntegrands[i]->getConfiguration();
				break;
			}
		}
			
		// parameters for integrators
		for (uint i=0; i<eqnIntegrands.size(); ++i) {
			stringstream term;
			term << "X" << i+1;
			if (name == term.str()) {
				param << "\"" << eqnIntegrators[i]->getName() << "\" " << eqnIntegrators[i]->getType();
				break;
			}
		}
	}
	
	return param.str();
}